

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadLayerOffsetArray
          (CrateReader *this,
          vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *d)

{
  StreamReader *pSVar1;
  uint64_t uVar2;
  bool bVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  size_t nbytes;
  size_t __n;
  uint64_t n;
  ostringstream ss_e;
  long *local_1c8;
  long local_1b8 [2];
  uint64_t local_1a8;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  local_1a8 = 0;
  bVar3 = StreamReader::read8(this->_sr,&local_1a8);
  if (bVar3) {
    if ((this->_config).maxArrayElements < local_1a8) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"ReadLayerOffsetArray",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(local_1a0,0x44a);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pcVar7 = "Too many array elements.";
      lVar6 = 0x18;
    }
    else {
      if (local_1a8 == 0) {
        return true;
      }
      uVar5 = local_1a8 * 0x10 + this->_memoryUsage;
      this->_memoryUsage = uVar5;
      if ((this->_config).maxMemoryBudget < uVar5) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"ReadLayerOffsetArray",0x14);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(local_1a0,0x451);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        pcVar7 = "Reached to max memory budget.";
        lVar6 = 0x1d;
      }
      else {
        ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::resize
                  (d,local_1a8);
        pSVar1 = this->_sr;
        uVar5 = local_1a8 * 0x10;
        uVar2 = pSVar1->idx_;
        __n = pSVar1->length_ - uVar2;
        if (uVar2 + uVar5 <= pSVar1->length_) {
          __n = uVar5;
        }
        if (__n - 1 < uVar5) {
          memcpy((d->
                 super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>).
                 _M_impl.super__Vector_impl_data._M_start,pSVar1->binary_ + uVar2,__n);
          pSVar1->idx_ = pSVar1->idx_ + __n;
          return true;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_1a0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"ReadLayerOffsetArray",0x14);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(local_1a0,0x458);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        pcVar7 = "Failed to read LayerOffset[] data.";
        lVar6 = 0x22;
      }
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"ReadLayerOffsetArray",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a0,0x445);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar7 = "Failed to read the number of array elements.";
    lVar6 = 0x2c;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar7,lVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1c8);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  ::std::ios_base::~ios_base(local_130);
  return false;
}

Assistant:

bool CrateReader::ReadLayerOffsetArray(std::vector<LayerOffset> *d) {
  // array data is not compressed

  uint64_t n{0};
  if (!_sr->read8(&n)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    return false;
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  if (n == 0) {
    return true;
  }

  CHECK_MEMORY_USAGE(size_t(n) * sizeof(LayerOffset));

  d->resize(size_t(n));

  if (!_sr->read(size_t(n) * sizeof(LayerOffset),
                 size_t(n) * sizeof(LayerOffset),
                 reinterpret_cast<uint8_t *>(d->data()))) {
    PUSH_ERROR("Failed to read LayerOffset[] data.");
    return false;
  }

  return true;
}